

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O1

int uv__idna_toascii_label(char *s,char *se,char **d,char *de)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  char *ss;
  char *local_60;
  ulong local_58;
  int local_4c;
  char **local_48;
  char *local_40;
  char *local_38;
  
  local_58 = 0;
  iVar15 = 0;
  pcVar13 = de;
  local_60 = s;
  local_40 = s;
  while( true ) {
    if (local_60 <= se) {
      uVar7 = uv__utf8_decode1(&local_60,se);
      pcVar13 = (char *)(ulong)uVar7;
    }
    if (se < local_60) break;
    if ((uint)pcVar13 < 0x80) {
      local_58 = (ulong)((int)local_58 + 1);
    }
    else {
      if ((uint)pcVar13 == 0xffffffff) {
        return -0x16;
      }
      iVar15 = iVar15 + 1;
    }
  }
  if (iVar15 != 0) {
    pcVar2 = *d;
    if (pcVar2 < de) {
      *d = pcVar2 + 1;
      *pcVar2 = 'x';
    }
    pcVar2 = *d;
    if (pcVar2 < de) {
      *d = pcVar2 + 1;
      *pcVar2 = 'n';
    }
    pcVar2 = *d;
    if (pcVar2 < de) {
      *d = pcVar2 + 1;
      *pcVar2 = '-';
    }
    pcVar2 = *d;
    if (pcVar2 < de) {
      *d = pcVar2 + 1;
      *pcVar2 = '-';
    }
  }
  local_60 = local_40;
  iVar14 = 0;
  do {
    do {
      if (local_60 <= se) {
        uVar7 = uv__utf8_decode1(&local_60,se);
        pcVar13 = (char *)(ulong)uVar7;
      }
      if (se < local_60) goto LAB_00109a30;
    } while (0x7f < (uint)pcVar13);
    pcVar2 = *d;
    if (pcVar2 < de) {
      *d = pcVar2 + 1;
      *pcVar2 = (char)pcVar13;
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != (int)local_58);
LAB_00109a30:
  iVar14 = (int)local_58;
  if (iVar15 != 0) {
    if (((int)local_58 != 0) && (pcVar2 = *d, pcVar2 < de)) {
      *d = pcVar2 + 1;
      *pcVar2 = '-';
    }
    uVar9 = 0x80;
    uVar10 = 0x48;
    uVar7 = 0;
    local_4c = 1;
    local_48 = d;
    local_38 = de;
    do {
      local_60 = local_40;
      uVar17 = 0xffffffff;
      while( true ) {
        if (local_60 <= se) {
          uVar8 = uv__utf8_decode1(&local_60,se);
          pcVar13 = (char *)(ulong)uVar8;
        }
        pcVar2 = local_38;
        if (se < local_60) break;
        uVar12 = (uint)pcVar13;
        uVar8 = uVar17;
        if (uVar12 < uVar17) {
          uVar8 = uVar12;
        }
        if (uVar9 <= uVar12) {
          uVar17 = uVar8;
        }
      }
      uVar8 = (int)local_58 + 1;
      if (~uVar7 / uVar8 < uVar17 - uVar9) {
        return -7;
      }
      uVar7 = uVar7 + (uVar17 - uVar9) * uVar8;
      local_60 = local_40;
      while( true ) {
        if (local_60 <= se) {
          uVar9 = uv__utf8_decode1(&local_60,se);
          pcVar13 = (char *)(ulong)uVar9;
        }
        if (se < local_60) break;
        if (((uint)pcVar13 < uVar17) && (uVar7 = uVar7 + 1, uVar7 == 0)) {
          return -7;
        }
        if ((uint)pcVar13 == uVar17) {
          uVar9 = -(uVar10 - 0x24);
          if (0x19 < -(uVar10 - 0x24)) {
            uVar9 = 0x1a;
          }
          uVar16 = (ulong)uVar9;
          if (0x23 < uVar10) {
            uVar16 = 1;
          }
          uVar9 = uVar7;
          if ((uint)uVar16 <= uVar7) {
            uVar8 = 0x48;
            uVar11 = (ulong)uVar7;
            do {
              uVar5 = (ulong)(0x24 - (int)uVar16);
              uVar6 = (ulong)(uint)((int)uVar11 - (int)uVar16);
              uVar11 = uVar6 / uVar5;
              uVar9 = (uint)uVar11;
              pcVar3 = *local_48;
              if (pcVar3 < pcVar2) {
                cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[uVar16 + uVar6 % uVar5];
                *local_48 = pcVar3 + 1;
                *pcVar3 = cVar1;
              }
              uVar12 = uVar8 - uVar10;
              if (0x19 < uVar8 - uVar10) {
                uVar12 = 0x1a;
              }
              uVar16 = (ulong)uVar12;
              if (uVar8 <= uVar10) {
                uVar16 = 1;
              }
              uVar8 = uVar8 + 0x24;
            } while ((uint)uVar16 <= uVar9);
          }
          pcVar3 = *local_48;
          if (pcVar3 < pcVar2) {
            cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[uVar9];
            *local_48 = pcVar3 + 1;
            *pcVar3 = cVar1;
          }
          uVar16 = (ulong)uVar7 / 700;
          if (local_4c == 0) {
            uVar16 = (ulong)(uVar7 >> 1);
          }
          local_58 = (ulong)((int)local_58 + 1);
          uVar7 = 0;
          uVar10 = (int)(uVar16 / local_58) + (int)uVar16;
          if (uVar10 < 0x1c8) {
            iVar14 = 0;
          }
          else {
            iVar14 = 0;
            uVar9 = uVar10;
            do {
              uVar10 = uVar9 / 0x23;
              iVar14 = iVar14 + 0x24;
              bVar4 = 0x3e57 < uVar9;
              uVar9 = uVar10;
            } while (bVar4);
          }
          uVar10 = (uVar10 * 0x24) / (uVar10 + 0x26) + iVar14;
          iVar15 = iVar15 + -1;
          local_4c = 0;
        }
      }
      uVar7 = uVar7 + 1;
      uVar9 = uVar17 + 1;
      iVar14 = 0;
    } while (iVar15 != 0);
  }
  return iVar14;
}

Assistant:

static int uv__idna_toascii_label(const char* s, const char* se,
                                  char** d, char* de) {
  static const char alphabet[] = "abcdefghijklmnopqrstuvwxyz0123456789";
  const char* ss;
  unsigned c;
  unsigned h;
  unsigned k;
  unsigned n;
  unsigned m;
  unsigned q;
  unsigned t;
  unsigned x;
  unsigned y;
  unsigned bias;
  unsigned delta;
  unsigned todo;
  int first;

  h = 0;
  ss = s;
  todo = 0;

  foreach_codepoint(c, &s, se) {
    if (c < 128)
      h++;
    else if (c == (unsigned) -1)
      return UV_EINVAL;
    else
      todo++;
  }

  if (todo > 0) {
    if (*d < de) *(*d)++ = 'x';
    if (*d < de) *(*d)++ = 'n';
    if (*d < de) *(*d)++ = '-';
    if (*d < de) *(*d)++ = '-';
  }

  x = 0;
  s = ss;
  foreach_codepoint(c, &s, se) {
    if (c > 127)
      continue;

    if (*d < de)
      *(*d)++ = c;

    if (++x == h)
      break;  /* Visited all ASCII characters. */
  }

  if (todo == 0)
    return h;

  /* Only write separator when we've written ASCII characters first. */
  if (h > 0)
    if (*d < de)
      *(*d)++ = '-';

  n = 128;
  bias = 72;
  delta = 0;
  first = 1;

  while (todo > 0) {
    m = -1;
    s = ss;
    foreach_codepoint(c, &s, se)
      if (c >= n)
        if (c < m)
          m = c;

    x = m - n;
    y = h + 1;

    if (x > ~delta / y)
      return UV_E2BIG;  /* Overflow. */

    delta += x * y;
    n = m;

    s = ss;
    foreach_codepoint(c, &s, se) {
      if (c < n)
        if (++delta == 0)
          return UV_E2BIG;  /* Overflow. */

      if (c != n)
        continue;

      for (k = 36, q = delta; /* empty */; k += 36) {
        t = 1;

        if (k > bias)
          t = k - bias;

        if (t > 26)
          t = 26;

        if (q < t)
          break;

        /* TODO(bnoordhuis) Since 1 <= t <= 26 and therefore
         * 10 <= y <= 35, we can optimize the long division
         * into a table-based reciprocal multiplication.
         */
        x = q - t;
        y = 36 - t;  /* 10 <= y <= 35 since 1 <= t <= 26. */
        q = x / y;
        t = t + x % y;  /* 1 <= t <= 35 because of y. */

        if (*d < de)
          *(*d)++ = alphabet[t];
      }

      if (*d < de)
        *(*d)++ = alphabet[q];

      delta /= 2;

      if (first) {
        delta /= 350;
        first = 0;
      }

      /* No overflow check is needed because |delta| was just
       * divided by 2 and |delta+delta >= delta + delta/h|.
       */
      h++;
      delta += delta / h;

      for (bias = 0; delta > 35 * 26 / 2; bias += 36)
        delta /= 35;

      bias += 36 * delta / (delta + 38);
      delta = 0;
      todo--;
    }

    delta++;
    n++;
  }

  return 0;
}